

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesOverclockGetDomainControlPropertiesPrologue
          (ZESParameterValidation *this,zes_overclock_handle_t hDomainHandle,
          zes_overclock_control_t DomainControl,zes_control_property_t *pControlProperties)

{
  ze_result_t zVar1;
  
  if (hDomainHandle != (zes_overclock_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    if ((int)DomainControl < 0x801) {
      zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
      if (pControlProperties != (zes_control_property_t *)0x0) {
        zVar1 = ZE_RESULT_SUCCESS;
      }
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesOverclockGetDomainControlPropertiesPrologue(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Handle for the component.
        zes_control_property_t* pControlProperties      ///< [in,out] overclock control values.
        )
    {
        if( nullptr == hDomainHandle )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZES_OVERCLOCK_CONTROL_ACM_DISABLE < DomainControl )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( nullptr == pControlProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }